

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

utf8_char_t * utf8_load_text_file(char *path,size_t *size)

{
  FILE *__stream;
  ulong __n;
  size_t sVar1;
  ulong *in_RSI;
  char *in_RDI;
  size_t bytes_read;
  utf8_char_t *pos;
  size_t file_size;
  FILE *file;
  utf8_char_t *data;
  utf8_char_t *local_30;
  utf8_char_t *local_18;
  
  local_18 = (utf8_char_t *)0x0;
  __stream = fopen(in_RDI,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    if ((*in_RSI == 0) || (__n <= *in_RSI)) {
      *in_RSI = 0;
      local_18 = (utf8_char_t *)malloc(__n + 1);
      memset(local_18,0,__n);
      local_30 = local_18;
      if (local_18 != (utf8_char_t *)0x0) {
        while (sVar1 = fread(local_30,1,__n - *in_RSI,__stream), sVar1 != 0) {
          *in_RSI = sVar1 + *in_RSI;
          local_30 = local_30 + sVar1;
        }
      }
      fclose(__stream);
    }
  }
  local_18[*in_RSI] = '\0';
  return local_18;
}

Assistant:

utf8_char_t* utf8_load_text_file(const char* path, size_t* size)
{
    utf8_char_t* data = NULL;
    FILE* file = fopen(path, "r");

    if (file) {
        fseek(file, 0, SEEK_END);
        size_t file_size = ftell(file);
        fseek(file, 0, SEEK_SET);

        if (0 == (*size) || file_size <= (*size)) {
            (*size) = 0;
            data = (utf8_char_t*)malloc(1 + file_size);
            memset(data, '\0', file_size);

            if (data) {
                utf8_char_t* pos = data;
                size_t bytes_read = 0;

                while (0 < (bytes_read = fread(pos, 1, file_size - (*size), file))) {
                    pos += bytes_read;
                    (*size) += bytes_read;
                }
            }

            fclose(file);
        }
    }

    data[*size] = 0;
    return data;
}